

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

RegOpnd * __thiscall
Lowerer::GenerateFunctionTypeFromFixedFunctionObject
          (Lowerer *this,Instr *insertInstrPt,Opnd *functionObjOpnd)

{
  bool bVar1;
  RegOpnd *dst;
  AddrOpnd *pAVar2;
  IndirOpnd *src;
  RegOpnd *baseOpnd;
  
  dst = IR::RegOpnd::New(TyInt64,this->m_func);
  bVar1 = IR::Opnd::IsAddrOpnd(functionObjOpnd);
  if (bVar1) {
    pAVar2 = IR::Opnd::AsAddrOpnd(functionObjOpnd);
    src = (IndirOpnd *)
          IR::MemRefOpnd::New((void *)((long)pAVar2->m_address + 8),TyUint64,this->m_func,
                              AddrOpndKindDynamicObjectTypeRef);
  }
  else {
    baseOpnd = IR::Opnd::AsRegOpnd(functionObjOpnd);
    src = IR::IndirOpnd::New(baseOpnd,8,TyUint64,this->m_func,false);
  }
  InsertMove(&dst->super_Opnd,&src->super_Opnd,insertInstrPt,true);
  return dst;
}

Assistant:

IR::RegOpnd*
Lowerer::GenerateFunctionTypeFromFixedFunctionObject(IR::Instr *insertInstrPt, IR::Opnd* functionObjOpnd)
{
    IR::RegOpnd * functionTypeRegOpnd = IR::RegOpnd::New(TyMachReg, this->m_func);
    IR::Opnd *functionTypeOpnd = nullptr;

    if(functionObjOpnd->IsAddrOpnd())
    {
        IR::AddrOpnd* functionObjAddrOpnd = functionObjOpnd->AsAddrOpnd();
        // functionTypeRegOpnd = MOV [fixed function address + type offset]
        functionObjAddrOpnd->m_address;
        functionTypeOpnd = IR::MemRefOpnd::New((void *)((intptr_t)functionObjAddrOpnd->m_address + Js::RecyclableObject::GetOffsetOfType()), TyMachPtr, this->m_func,
            IR::AddrOpndKindDynamicObjectTypeRef);
    }
    else
    {
        functionTypeOpnd = IR::IndirOpnd::New(functionObjOpnd->AsRegOpnd(), Js::RecyclableObject::GetOffsetOfType(), TyMachPtr, this->m_func);
    }
    Lowerer::InsertMove(functionTypeRegOpnd, functionTypeOpnd, insertInstrPt);
    return functionTypeRegOpnd;
}